

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_datatype_from_string(char *name)

{
  int iVar1;
  int local_20;
  int c;
  int tablen;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = 0;
  }
  else {
    local_20 = 0x2a;
    while ((0 < local_20 && (iVar1 = strcmp(name,nifti_type_list[local_20].name), iVar1 != 0))) {
      local_20 = local_20 + -1;
    }
    name_local._4_4_ = nifti_type_list[local_20].type;
  }
  return name_local._4_4_;
}

Assistant:

int nifti_datatype_from_string( const char * name )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    if( !name ) return DT_UNKNOWN;

    for( c = tablen-1; c > 0; c-- )
        if( !strcmp(name, nifti_type_list[c].name) )
            break;

    return nifti_type_list[c].type;
}